

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_ManTimeStop(Abc_ManTime_t *p)

{
  int iVar1;
  Abc_ManTime_t *p_local;
  
  if ((p->tInDrive != (Abc_Time_t *)0x0) && (p->tInDrive != (Abc_Time_t *)0x0)) {
    free(p->tInDrive);
    p->tInDrive = (Abc_Time_t *)0x0;
  }
  if ((p->tOutLoad != (Abc_Time_t *)0x0) && (p->tOutLoad != (Abc_Time_t *)0x0)) {
    free(p->tOutLoad);
    p->tOutLoad = (Abc_Time_t *)0x0;
  }
  iVar1 = Vec_PtrSize(p->vArrs);
  if ((0 < iVar1) && (*p->vArrs->pArray != (void *)0x0)) {
    free(*p->vArrs->pArray);
    *p->vArrs->pArray = (void *)0x0;
  }
  Vec_PtrFree(p->vArrs);
  iVar1 = Vec_PtrSize(p->vReqs);
  if ((0 < iVar1) && (*p->vReqs->pArray != (void *)0x0)) {
    free(*p->vReqs->pArray);
    *p->vReqs->pArray = (void *)0x0;
  }
  Vec_PtrFree(p->vReqs);
  if (p != (Abc_ManTime_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_ManTimeStop( Abc_ManTime_t * p )
{
    if ( p->tInDrive )
        ABC_FREE( p->tInDrive );
    if ( p->tOutLoad )
        ABC_FREE( p->tOutLoad );
    if ( Vec_PtrSize(p->vArrs) > 0 )
        ABC_FREE( p->vArrs->pArray[0] );
    Vec_PtrFree( p->vArrs );
    if ( Vec_PtrSize(p->vReqs) > 0 )
        ABC_FREE( p->vReqs->pArray[0] );
    Vec_PtrFree( p->vReqs );
    ABC_FREE( p );
}